

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_sdot_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = desc * 8 & 0xff;
  uVar3 = (ulong)(uVar4 + 8);
  uVar5 = 0;
  do {
    *(int *)((long)vd + uVar5) =
         (int)*(char *)((long)vm + uVar5 + 2) * (int)*(char *)((long)vn + uVar5 + 2) +
         (int)*(char *)((long)vm + uVar5 + 1) * (int)*(char *)((long)vn + uVar5 + 1) +
         (int)*(char *)((long)vm + uVar5) * (int)*(char *)((long)vn + uVar5) +
         *(int *)((long)vd + uVar5) +
         (int)*(char *)((long)vm + uVar5 + 3) * (int)*(char *)((long)vn + uVar5 + 3);
    uVar5 = uVar5 + 4;
  } while (uVar3 != uVar5);
  uVar1 = desc >> 2 & 0xf8;
  if (uVar4 < uVar1) {
    uVar2 = (ulong)(uVar1 + 8);
    uVar5 = uVar3 + 8;
    if (uVar3 + 8 < uVar2) {
      uVar5 = uVar2;
    }
    memset((void *)((long)vd + uVar3),0,(~uVar3 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint32_t *d = vd;
    int8_t *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 4; ++i) {
        d[i] += n[i * 4 + 0] * m[i * 4 + 0]
              + n[i * 4 + 1] * m[i * 4 + 1]
              + n[i * 4 + 2] * m[i * 4 + 2]
              + n[i * 4 + 3] * m[i * 4 + 3];
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}